

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *this;
  mapped_type *pmVar3;
  idx_t i;
  ulong uVar4;
  ulong uVar5;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = uVar4;
    if (*local_c0 != 0) {
      uVar5 = (ulong)*(uint *)(*local_c0 + uVar4 * 4);
    }
    if ((local_b0 == 0) || ((*(ulong *)(local_b0 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0)) {
      uVar2 = uVar4;
      if (*local_78 != 0) {
        uVar2 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
      }
      plVar1 = *(long **)(local_70 + uVar2 * 8);
      this = (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              *)*plVar1;
      if (this == (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                   *)0x0) {
        this = StringMapType<duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
               ::CreateEmpty(aggr_input->allocator);
        *plVar1 = (long)this;
      }
      pmVar3 = OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
               ::operator[](this,(key_type *)(uVar5 * 0x10 + local_b8));
      *pmVar3 = *pmVar3 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}